

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O1

bool __thiscall NaPetriNet::ask_for_node(NaPetriNet *this,NaPetriNode *pNode,int *pIndex)

{
  NaPNodePtrAr *pNVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  uint uVar4;
  
  iVar2 = (this->pnaNet).nItems;
  bVar3 = 0 < iVar2;
  if (0 < iVar2) {
    pNVar1 = &this->pnaNet;
    uVar4 = 0;
    iVar2 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,0);
    if (*(NaPetriNode **)CONCAT44(extraout_var,iVar2) != pNode) {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        iVar2 = (this->pnaNet).nItems;
        bVar3 = (int)uVar4 < iVar2;
        if (iVar2 <= (int)uVar4) {
          return bVar3;
        }
        iVar2 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar4);
      } while (*(NaPetriNode **)CONCAT44(extraout_var_00,iVar2) != pNode);
    }
    if (pIndex != (int *)0x0) {
      *pIndex = uVar4;
    }
  }
  return bVar3;
}

Assistant:

bool
NaPetriNet::ask_for_node (NaPetriNode* pNode, int *pIndex)
{
    int i;
    for(i = 0; i < pnaNet.count(); ++i){
        if(pNode == pnaNet[i]){
            if(NULL != pIndex){
                *pIndex = i;
            }
            return true;
        }
    }
    return false;
}